

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

QVariantHash contactInfo(QString *name,QString *email)

{
  QVariant *pQVar1;
  QString *in_RDX;
  QString local_a8;
  QVariant local_90;
  QString local_70;
  QVariant local_48;
  undefined1 local_21;
  QString *local_20;
  QString *email_local;
  QString *name_local;
  QVariantHash *map;
  
  local_21 = 0;
  local_20 = in_RDX;
  email_local = email;
  name_local = name;
  QHash<QString,_QVariant>::QHash((QHash<QString,_QVariant> *)name);
  QVariant::QVariant(&local_48,(QString *)email_local);
  QString::QString(&local_70,"name");
  pQVar1 = QHash<QString,_QVariant>::operator[]((QHash<QString,_QVariant> *)name,&local_70);
  QVariant::operator=(pQVar1,&local_48);
  QString::~QString(&local_70);
  QVariant::~QVariant(&local_48);
  QVariant::QVariant(&local_90,local_20);
  QString::QString(&local_a8,"email");
  pQVar1 = QHash<QString,_QVariant>::operator[]((QHash<QString,_QVariant> *)name,&local_a8);
  QVariant::operator=(pQVar1,&local_90);
  QString::~QString(&local_a8);
  QVariant::~QVariant(&local_90);
  return (QVariantHash)(Data *)name;
}

Assistant:

QVariantHash contactInfo(const QString& name, const QString& email)
{
	QVariantHash map;
	map["name"] = name;
	map["email"] = email;
	return map;
}